

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PInt::SetValue(PInt *this,void *addr,int val)

{
  if ((*(int *)&this->field_0x28 - 1U & (uint)addr) == 0) {
    switch(*(undefined4 *)&this->field_0x24) {
    case 1:
      *(char *)addr = (char)val;
      break;
    case 2:
      *(short *)addr = (short)val;
      break;
    default:
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0x392,"virtual void PInt::SetValue(void *, int)");
    case 4:
      *(int *)addr = val;
      break;
    case 8:
      *(long *)addr = (long)val;
    }
    return;
  }
  __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x37f,"virtual void PInt::SetValue(void *, int)");
}

Assistant:

void PInt::SetValue(void *addr, int val)
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		*(int *)addr = val;
	}
	else if (Size == 1)
	{
		*(BYTE *)addr = val;
	}
	else if (Size == 2)
	{
		*(WORD *)addr = val;
	}
	else if (Size == 8)
	{
		*(QWORD *)addr = val;
	}
	else
	{
		assert(0 && "Unhandled integer size");
	}
}